

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

void color_tree_add(ColorTree *tree,uchar r,uchar g,uchar b,uchar a,uint index)

{
  int iVar1;
  void *pvVar2;
  byte in_CL;
  byte bVar3;
  byte in_DL;
  byte in_SIL;
  long in_RDI;
  byte in_R8B;
  undefined4 in_R9D;
  int i;
  int bit;
  undefined4 local_14;
  undefined8 local_8;
  
  local_8 = in_RDI;
  for (local_14 = 0; local_14 < 8; local_14 = local_14 + 1) {
    bVar3 = (byte)local_14;
    iVar1 = ((int)(uint)in_SIL >> (bVar3 & 0x1f) & 1U) * 8 +
            ((int)(uint)in_DL >> (bVar3 & 0x1f) & 1U) * 4 +
            ((int)(uint)in_CL >> (bVar3 & 0x1f) & 1U) * 2 +
            ((int)(uint)in_R8B >> (bVar3 & 0x1f) & 1U);
    if (*(long *)(local_8 + (long)iVar1 * 8) == 0) {
      pvVar2 = lodepng_malloc(0x11ac31);
      *(void **)(local_8 + (long)iVar1 * 8) = pvVar2;
      color_tree_init(*(ColorTree **)(local_8 + (long)iVar1 * 8));
    }
    local_8 = *(long *)(local_8 + (long)iVar1 * 8);
  }
  *(undefined4 *)(local_8 + 0x80) = in_R9D;
  return;
}

Assistant:

static void color_tree_add(ColorTree* tree,
	unsigned char r, unsigned char g, unsigned char b, unsigned char a, unsigned index)
{
	int bit;
	for (bit = 0; bit < 8; ++bit)
	{
		int i = 8 * ((r >> bit) & 1) + 4 * ((g >> bit) & 1) + 2 * ((b >> bit) & 1) + 1 * ((a >> bit) & 1);
		if (!tree->children[i])
		{
			tree->children[i] = (ColorTree*)lodepng_malloc(sizeof(ColorTree));
			color_tree_init(tree->children[i]);
		}
		tree = tree->children[i];
	}
	tree->index = (int)index;
}